

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticitiesAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::writeValueTo
          (TypedAttribute<Imf_3_4::Chromaticities> *this,OStream *os,int version)

{
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).red.x);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).red.y);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).green.x);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).green.y);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).blue.x);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).blue.y);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).white.x);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).white.y);
  return;
}

Assistant:

IMF_EXPORT void
ChromaticitiesAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.red.x);
    Xdr::write<StreamIO> (os, _value.red.y);
    Xdr::write<StreamIO> (os, _value.green.x);
    Xdr::write<StreamIO> (os, _value.green.y);
    Xdr::write<StreamIO> (os, _value.blue.x);
    Xdr::write<StreamIO> (os, _value.blue.y);
    Xdr::write<StreamIO> (os, _value.white.x);
    Xdr::write<StreamIO> (os, _value.white.y);
}